

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O0

void handleFileAction(efsw_watcher watcher,efsw_watchid watchid,char *dir,char *filename,
                     efsw_action action,char *oldFilename,void *param)

{
  size_t sVar1;
  char *pcVar2;
  char *oldFilename_local;
  efsw_action action_local;
  char *filename_local;
  char *dir_local;
  efsw_watchid watchid_local;
  efsw_watcher watcher_local;
  
  sVar1 = strlen(oldFilename);
  if (sVar1 == 0) {
    pcVar2 = getActionName(action);
    printf("Watch ID %ld DIR (%s) FILE (%s) has event %s\n",watchid,dir,filename,pcVar2);
  }
  else {
    pcVar2 = getActionName(action);
    printf("Watch ID %ld DIR (%s) FILE (from file %s to %s) has event %s\n",watchid,dir,oldFilename,
           filename,pcVar2);
  }
  return;
}

Assistant:

void handleFileAction( efsw_watcher watcher, efsw_watchid watchid, 
						const char* dir, const char* filename,
						enum efsw_action action, const char* oldFilename,
						void* param ) {
	if ( strlen( oldFilename ) == 0 ) {
		printf( "Watch ID %ld DIR (%s) FILE (%s) has event %s\n", 
			watchid, dir, filename, getActionName( action ));
	} else {
		printf( "Watch ID %ld DIR (%s) FILE (from file %s to %s) has event %s\n",
			watchid, dir, oldFilename, filename, getActionName( action ));
	}
}